

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

int getopts(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  bsdunzip bsdunzip_storage;
  bsdunzip local_58;
  
  bsdunzip_optind = 1;
  local_58.argument = (char *)0x0;
  local_58.getopt_state = 0;
  local_58._4_4_ = 0;
  local_58.getopt_word = (char *)0x0;
  local_58._20_4_ = 0;
  local_58.argc = argc;
  local_58.argv = argv;
  do {
    iVar1 = bsdunzip_getopt(&local_58);
    if (iVar1 == -1) {
      return bsdunzip_optind;
    }
    unzip_exclude_mode = 0;
    switch(iVar1) {
    case 0x49:
    case 0x4f:
      O_arg = local_58.argument;
      break;
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6b:
    case 0x6d:
    case 0x72:
    case 0x73:
    case 0x77:
switchD_00103bf2_caseD_4a:
      usage();
      return extraout_EAX;
    case 0x4c:
      L_opt = 1;
      break;
    case 0x50:
      P_arg = local_58.argument;
      break;
    case 0x5a:
      zipinfo_mode = 1;
      if (((local_58.argument != (char *)0x0) && (*local_58.argument == '1')) &&
         (local_58.argument[1] == '\0')) {
        Z1_opt = 1;
      }
      break;
    case 0x61:
      a_opt = 1;
      break;
    case 99:
      c_opt = 1;
      break;
    case 100:
      d_arg = local_58.argument;
      break;
    case 0x66:
      f_opt = 1;
      break;
    case 0x6a:
      j_opt = 1;
      break;
    case 0x6c:
      if (v_opt == 0) {
        v_opt = 1;
      }
      break;
    case 0x6e:
      n_opt = 1;
      break;
    case 0x6f:
      o_opt = 1;
      q_opt = 1;
      break;
    case 0x70:
      p_opt = 1;
      break;
    case 0x71:
      q_opt = 1;
      break;
    case 0x74:
      t_opt = 1;
      break;
    case 0x75:
      u_opt = 1;
      break;
    case 0x76:
      v_opt = 2;
      break;
    case 0x78:
      add_pattern(&exclude,local_58.argument);
      unzip_exclude_mode = 1;
      break;
    case 0x79:
      y_str = "  ";
      break;
    default:
      if (iVar1 == 1) {
        version_opt = 1;
      }
      else {
        if (iVar1 != 0x43) {
          if (iVar1 == 0) {
            unzip_exclude_mode = 0;
            return bsdunzip_optind;
          }
          goto switchD_00103bf2_caseD_4a;
        }
        C_opt = 1;
      }
    }
  } while( true );
}

Assistant:

static int
getopts(int argc, char *argv[])
{
	struct bsdunzip *bsdunzip, bsdunzip_storage;
	int opt;
	bsdunzip_optind = 1;

	bsdunzip = &bsdunzip_storage;
	memset(bsdunzip, 0, sizeof(*bsdunzip));

        bsdunzip->argv = argv;
        bsdunzip->argc = argc;

	while ((opt = bsdunzip_getopt(bsdunzip)) != -1) {
		unzip_exclude_mode = 0;
		switch (opt) {
		case 'a':
			a_opt = 1;
			break;
		case 'C':
			C_opt = 1;
			break;
		case 'c':
			c_opt = 1;
			break;
		case 'd':
			d_arg = bsdunzip->argument;
			break;
		case 'f':
			f_opt = 1;
			break;
		case 'I':
		case 'O':
			O_arg = bsdunzip->argument;
			break;
		case 'j':
			j_opt = 1;
			break;
		case 'L':
			L_opt = 1;
			break;
		case 'l':
			if (v_opt == 0)
				v_opt = 1;
			break;
		case 'n':
			n_opt = 1;
			break;
		case 'o':
			o_opt = 1;
			q_opt = 1;
			break;
		case 'p':
			p_opt = 1;
			break;
		case 'P':
			P_arg = bsdunzip->argument;
			break;
		case 'q':
			q_opt = 1;
			break;
		case 't':
			t_opt = 1;
			break;
		case 'u':
			u_opt = 1;
			break;
		case 'v':
			v_opt = 2;
			break;
		case 'x':
			add_pattern(&exclude, bsdunzip->argument);
			unzip_exclude_mode = 1;
			break;
		case 'y':
			y_str = "  ";
			break;
		case 'Z':
			zipinfo_mode = 1;
			if (bsdunzip->argument != NULL &&
			    strcmp(bsdunzip->argument, "1") == 0) {
				Z1_opt = 1;
			}
			break;
		case OPTION_VERSION:
			version_opt = 1;
			break;
		case OPTION_NONE:
			break;
		default:
			usage();
		}
		if (opt == OPTION_NONE)
			break;
	}
	return (bsdunzip_optind);
}